

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDVertex * __thiscall
ON_SubD::AddVertexForExperts
          (ON_SubD *this,uint candidate_vertex_id,ON_SubDVertexTag vertex_tag,double *P,
          uint initial_edge_capacity,uint initial_face_capacity)

{
  ON_SubDimple *this_00;
  ON_SubDVertex *v;
  uint level;
  
  this_00 = SubDimple(this,true);
  v = (ON_SubDVertex *)0x0;
  level = 0;
  if (this_00 != (ON_SubDimple *)0x0) {
    if (this_00->m_active_level != (ON_SubDLevel *)0x0) {
      level = this_00->m_active_level->m_level_index;
    }
    v = ON_SubDimple::AllocateVertex
                  (this_00,candidate_vertex_id,vertex_tag,level,P,initial_edge_capacity,
                   initial_face_capacity);
    ON_SubDimple::AddVertexToLevel(this_00,v);
  }
  return v;
}

Assistant:

ON_SubDVertex* ON_SubD::AddVertexForExperts(
  unsigned int candidate_vertex_id,
  ON_SubDVertexTag vertex_tag,
  const double* P,
  unsigned int initial_edge_capacity,
  unsigned int initial_face_capacity
)
{
  ON_SubDimple* subdimple = SubDimple(true);
  if (0 == subdimple)
    return 0;
  ON_SubDVertex* v = subdimple->AllocateVertex( candidate_vertex_id, vertex_tag, subdimple->ActiveLevelIndex(), P, initial_edge_capacity, initial_face_capacity);
  subdimple->AddVertexToLevel(v);
  return v;
}